

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

int uv_mutex_init_recursive(uv_mutex_t *mutex)

{
  int iVar1;
  int iVar2;
  pthread_mutexattr_t local_14;
  int err;
  pthread_mutexattr_t attr;
  uv_mutex_t *mutex_local;
  
  _err = mutex;
  iVar1 = pthread_mutexattr_init(&local_14);
  if (iVar1 != 0) {
    abort();
  }
  iVar1 = pthread_mutexattr_settype(&local_14,1);
  if (iVar1 != 0) {
    abort();
  }
  iVar1 = pthread_mutex_init((pthread_mutex_t *)_err,&local_14);
  iVar2 = pthread_mutexattr_destroy(&local_14);
  if (iVar2 != 0) {
    abort();
  }
  return -iVar1;
}

Assistant:

int uv_mutex_init_recursive(uv_mutex_t* mutex) {
  pthread_mutexattr_t attr;
  int err;

  if (pthread_mutexattr_init(&attr))
    abort();

  if (pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE))
    abort();

  err = pthread_mutex_init(mutex, &attr);

  if (pthread_mutexattr_destroy(&attr))
    abort();

  return UV__ERR(err);
}